

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_4.cxx
# Opt level: O1

int main(void)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a_func = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"b_func = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x32);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(){
    int a= 10;

    calc(&a,a_func);
    std::cout << "a_func = " << a << std::endl;

    a = 10;
    calc(&a,b_func);
    std::cout << "b_func = " << a << std::endl;
}